

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statements.cpp
# Opt level: O3

bool __thiscall Functions::findFunction(Functions *this,Function *function)

{
  bool bVar1;
  pointer ppFVar2;
  pointer ppFVar3;
  long *plVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  bool bVar8;
  string findFID;
  string stackFID;
  vector<Function_*,_std::allocator<Function_*>_> local_88;
  vector<Function_*,_std::allocator<Function_*>_> local_68;
  long *local_50;
  pointer local_48;
  long local_40 [2];
  
  if (function != (Function *)0x0) {
    std::vector<Function_*,_std::allocator<Function_*>_>::vector(&local_88,&this->_functionStack);
    ppFVar3 = local_88.super__Vector_base<Function_*,_std::allocator<Function_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    ppFVar2 = local_88.super__Vector_base<Function_*,_std::allocator<Function_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (local_88.super__Vector_base<Function_*,_std::allocator<Function_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_88.super__Vector_base<Function_*,_std::allocator<Function_*>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_88.super__Vector_base<Function_*,_std::allocator<Function_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_88.super__Vector_base<Function_*,_std::allocator<Function_*>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (ppFVar2 != ppFVar3) {
      uVar6 = 0;
      do {
        std::vector<Function_*,_std::allocator<Function_*>_>::vector
                  (&local_88,&this->_functionStack);
        uVar7 = (long)local_88.super__Vector_base<Function_*,_std::allocator<Function_*>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)local_88.super__Vector_base<Function_*,_std::allocator<Function_*>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3;
        bVar1 = uVar6 < uVar7;
        if (local_88.super__Vector_base<Function_*,_std::allocator<Function_*>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_88.super__Vector_base<Function_*,_std::allocator<Function_*>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_88.super__Vector_base<Function_*,_std::allocator<Function_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_88.super__Vector_base<Function_*,_std::allocator<Function_*>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (uVar7 <= uVar6) {
          return bVar1;
        }
        (*(function->super_Statement)._vptr_Statement[3])(&local_88,function);
        std::vector<Function_*,_std::allocator<Function_*>_>::vector
                  (&local_68,&this->_functionStack);
        (*(local_68.super__Vector_base<Function_*,_std::allocator<Function_*>_>._M_impl.
           super__Vector_impl_data._M_start[uVar6]->super_Statement)._vptr_Statement[3])(&local_50);
        if (local_68.super__Vector_base<Function_*,_std::allocator<Function_*>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_68.super__Vector_base<Function_*,_std::allocator<Function_*>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_68.super__Vector_base<Function_*,_std::allocator<Function_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_68.super__Vector_base<Function_*,_std::allocator<Function_*>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        plVar4 = local_50;
        if (local_88.super__Vector_base<Function_*,_std::allocator<Function_*>_>._M_impl.
            super__Vector_impl_data._M_finish == local_48) {
          if (local_88.super__Vector_base<Function_*,_std::allocator<Function_*>_>._M_impl.
              super__Vector_impl_data._M_finish == (pointer)0x0) {
            bVar8 = true;
          }
          else {
            iVar5 = bcmp(local_88.super__Vector_base<Function_*,_std::allocator<Function_*>_>.
                         _M_impl.super__Vector_impl_data._M_start,local_50,
                         (size_t)local_88.
                                 super__Vector_base<Function_*,_std::allocator<Function_*>_>._M_impl
                                 .super__Vector_impl_data._M_finish);
            bVar8 = iVar5 == 0;
          }
        }
        else {
          bVar8 = false;
        }
        if (plVar4 != local_40) {
          operator_delete(plVar4,local_40[0] + 1);
        }
        if (local_88.super__Vector_base<Function_*,_std::allocator<Function_*>_>._M_impl.
            super__Vector_impl_data._M_start !=
            (pointer)&local_88.super__Vector_base<Function_*,_std::allocator<Function_*>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage) {
          operator_delete(local_88.super__Vector_base<Function_*,_std::allocator<Function_*>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_88.super__Vector_base<Function_*,_std::allocator<Function_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
        }
        uVar6 = uVar6 + 1;
      } while (!bVar8);
      return bVar1;
    }
  }
  return false;
}

Assistant:

bool Functions::findFunction(Function *function) {
    if(function == nullptr) return false;
    if(!getFunctionStack().empty()) {
        for (int i = 0; i < getFunctionStack().size(); i++) {
            std::string findFID = function->id();
            std::string stackFID = getFunctionStack()[i]->id();
            if (findFID == stackFID) {
                return true;
            }
        }
    }
    return false;
}